

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O3

DdNode * Cudd_addNonSimCompose(DdManager *dd,DdNode *f,DdNode **vector)

{
  int *piVar1;
  uint uVar2;
  DdNode *pDVar3;
  bool bVar4;
  DdNode *pDVar5;
  DdNode *cube;
  DdNode *g;
  ulong uVar6;
  DdNode *pDVar7;
  ulong uVar8;
  uint lastsub;
  
  cube = dd->one;
  piVar1 = (int *)(((ulong)cube & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 2;
  pDVar7 = cube;
  g = cube;
  uVar8 = (long)dd->size;
  pDVar5 = cube;
  if (0 < (long)dd->size) {
    do {
      pDVar3 = vector[uVar8 - 1];
      if (((uVar8 - 1 != (ulong)pDVar3->index) || ((pDVar3->type).kids.T != dd->one)) ||
         (pDVar5 = pDVar7, cube = g, (pDVar3->type).kids.E != dd->zero)) {
        pDVar5 = Cudd_addIthVar(dd,(int)uVar8 + -1);
        if (pDVar5 == (DdNode *)0x0) {
LAB_007f8324:
          pDVar5 = g;
          Cudd_RecursiveDeref(dd,pDVar7);
        }
        else {
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          cube = Cudd_addApply(dd,Cudd_addTimes,pDVar5,g);
          if (cube == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar7);
            pDVar7 = g;
          }
          else {
            piVar1 = (int *)(((ulong)cube & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,g);
            g = Cudd_addApply(dd,Cudd_addXnor,pDVar5,vector[uVar8 - 1]);
            if (g != (DdNode *)0x0) {
              piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              Cudd_RecursiveDeref(dd,pDVar5);
              pDVar5 = Cudd_addApply(dd,Cudd_addTimes,pDVar7,g);
              if (pDVar5 != (DdNode *)0x0) {
                piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                Cudd_RecursiveDeref(dd,pDVar7);
                Cudd_RecursiveDeref(dd,g);
                goto LAB_007f8227;
              }
              goto LAB_007f8324;
            }
          }
          Cudd_RecursiveDeref(dd,pDVar7);
        }
        Cudd_RecursiveDeref(dd,pDVar5);
        goto LAB_007f8334;
      }
LAB_007f8227:
      bVar4 = 1 < uVar8;
      pDVar7 = pDVar5;
      g = cube;
      uVar8 = uVar8 - 1;
    } while (bVar4);
  }
  do {
    uVar2 = dd->size;
    uVar6 = (ulong)uVar2;
    uVar8 = uVar6;
    while( true ) {
      uVar8 = uVar8 - 1;
      lastsub = (int)uVar2 >> 0x1f & uVar2;
      if ((int)uVar8 + 1 < 1) break;
      pDVar7 = vector[uVar8];
      if (uVar8 != pDVar7->index) {
        lastsub = (int)uVar8 + 1;
        break;
      }
      lastsub = (uint)uVar6;
      if (((pDVar7->type).kids.T != dd->one) ||
         (uVar6 = uVar6 - 1, (pDVar7->type).kids.E != dd->zero)) break;
    }
    dd->reordered = 0;
    pDVar7 = cuddAddNonSimComposeRecur(dd,f,vector,pDVar5,cube,lastsub);
    if (pDVar7 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
  } while (dd->reordered == 1);
  Cudd_RecursiveDeref(dd,pDVar5);
  Cudd_RecursiveDeref(dd,cube);
  if (pDVar7 == (DdNode *)0x0) {
LAB_007f8334:
    pDVar7 = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  return pDVar7;
}

Assistant:

DdNode *
Cudd_addNonSimCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vector)
{
    DdNode              *cube, *key, *var, *tmp, *piece;
    DdNode              *res;
    int                 i, lastsub;

    /* The cache entry for this function is composed of three parts:
    ** f itself, the replacement relation, and the cube of the
    ** variables being substituted.
    ** The replacement relation is the product of the terms (yi EXNOR gi).
    ** This apporach allows us to use the global cache for this function,
    ** with great savings in memory with respect to using arrays for the
    ** cache entries.
    ** First we build replacement relation and cube of substituted
    ** variables from the vector specifying the desired composition.
    */
    key = DD_ONE(dd);
    cuddRef(key);
    cube = DD_ONE(dd);
    cuddRef(cube);
    for (i = (int) dd->size - 1; i >= 0; i--) {
        if (ddIsIthAddVar(dd,vector[i],(unsigned int)i)) {
            continue;
        }
        var = Cudd_addIthVar(dd,i);
        if (var == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(var);
        /* Update cube. */
        tmp = Cudd_addApply(dd,Cudd_addTimes,var,cube);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,cube);
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cube);
        cube = tmp;
        /* Update replacement relation. */
        piece = Cudd_addApply(dd,Cudd_addXnor,var,vector[i]);
        if (piece == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(piece);
        Cudd_RecursiveDeref(dd,var);
        tmp = Cudd_addApply(dd,Cudd_addTimes,key,piece);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,piece);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,key);
        Cudd_RecursiveDeref(dd,piece);
        key = tmp;
    }

    /* Now try composition, until no reordering occurs. */
    do {
        /* Find real substitution with largest index. */
        for (lastsub = dd->size - 1; lastsub >= 0; lastsub--) {
            if (!ddIsIthAddVar(dd,vector[lastsub],(unsigned int)lastsub)) {
                break;
            }
        }

        /* Recursively solve the problem. */
        dd->reordered = 0;
        res = cuddAddNonSimComposeRecur(dd,f,vector,key,cube,lastsub+1);
        if (res != NULL) cuddRef(res);

    } while (dd->reordered == 1);

    Cudd_RecursiveDeref(dd,key);
    Cudd_RecursiveDeref(dd,cube);
    if (res != NULL) cuddDeref(res);
    return(res);

}